

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::LRUCache::Unref(LRUCache *this,LRUHandle *e)

{
  _func_void_Slice_ptr_void_ptr *p_Var1;
  Slice local_28;
  LRUHandle *local_18;
  LRUHandle *e_local;
  LRUCache *this_local;
  
  local_18 = e;
  e_local = (LRUHandle *)this;
  if (e->refs == 0) {
    __assert_fail("e->refs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                  ,0xe3,"void leveldb::(anonymous namespace)::LRUCache::Unref(LRUHandle *)");
  }
  e->refs = e->refs - 1;
  if (e->refs == 0) {
    if (((e->in_cache ^ 0xffU) & 1) == 0) {
      __assert_fail("!e->in_cache",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                    ,0xe6,"void leveldb::(anonymous namespace)::LRUCache::Unref(LRUHandle *)");
    }
    p_Var1 = e->deleter;
    local_28 = LRUHandle::key(e);
    (*p_Var1)(&local_28,local_18->value);
    free(local_18);
  }
  else if (((e->in_cache & 1U) != 0) && (e->refs == 1)) {
    LRU_Remove(this,e);
    LRU_Append(this,&this->lru_,local_18);
  }
  return;
}

Assistant:

void LRUCache::Unref(LRUHandle* e) {
  assert(e->refs > 0);
  e->refs--;
  if (e->refs == 0) {  // Deallocate.
    assert(!e->in_cache);
    (*e->deleter)(e->key(), e->value);
    free(e);
  } else if (e->in_cache && e->refs == 1) {
    // No longer in use; move to lru_ list.
    LRU_Remove(e);
    LRU_Append(&lru_, e);
  }
}